

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O0

void __thiscall
Inline::SetupInlineInstrForCallDirect
          (Inline *this,BuiltinFunction builtInId,Instr *callInstr,Instr *argoutInstr)

{
  _E _Var1;
  HelperCallOpnd *pHVar2;
  Opnd *newSrc;
  Instr *argoutInstr_local;
  Instr *callInstr_local;
  Inline *this_local;
  BuiltinFunction builtInId_local;
  
  this_local._7_1_ = builtInId._value;
  _Var1 = Js::BuiltinFunction::operator_cast_to__E((BuiltinFunction *)((long)&this_local + 7));
  switch(_Var1) {
  case JavascriptString_At:
    pHVar2 = IR::HelperCallOpnd::New(HelperString_At,callInstr->m_func);
    IR::Instr::SetSrc1(callInstr,&pHVar2->super_Opnd);
    break;
  case JavascriptString_CharAt:
    pHVar2 = IR::HelperCallOpnd::New(HelperString_CharAt,callInstr->m_func);
    IR::Instr::SetSrc1(callInstr,&pHVar2->super_Opnd);
    break;
  case JavascriptString_CharCodeAt:
    pHVar2 = IR::HelperCallOpnd::New(HelperString_CharCodeAt,callInstr->m_func);
    IR::Instr::SetSrc1(callInstr,&pHVar2->super_Opnd);
    break;
  case JavascriptString_Concat:
    pHVar2 = IR::HelperCallOpnd::New(HelperString_Concat,callInstr->m_func);
    IR::Instr::SetSrc1(callInstr,&pHVar2->super_Opnd);
    break;
  case JavascriptString_FromCharCode:
    pHVar2 = IR::HelperCallOpnd::New(HelperString_FromCharCode,callInstr->m_func);
    IR::Instr::SetSrc1(callInstr,&pHVar2->super_Opnd);
    break;
  case JavascriptString_FromCodePoint:
    pHVar2 = IR::HelperCallOpnd::New(HelperString_FromCodePoint,callInstr->m_func);
    IR::Instr::SetSrc1(callInstr,&pHVar2->super_Opnd);
    break;
  case JavascriptString_IndexOf:
    pHVar2 = IR::HelperCallOpnd::New(HelperString_IndexOf,callInstr->m_func);
    IR::Instr::SetSrc1(callInstr,&pHVar2->super_Opnd);
    break;
  case JavascriptString_LastIndexOf:
    pHVar2 = IR::HelperCallOpnd::New(HelperString_LastIndexOf,callInstr->m_func);
    IR::Instr::SetSrc1(callInstr,&pHVar2->super_Opnd);
    break;
  case JavascriptString_Link:
    pHVar2 = IR::HelperCallOpnd::New(HelperString_Link,callInstr->m_func);
    IR::Instr::SetSrc1(callInstr,&pHVar2->super_Opnd);
    break;
  case JavascriptString_Match:
    pHVar2 = IR::HelperCallOpnd::New(HelperString_Match,callInstr->m_func);
    IR::Instr::SetSrc1(callInstr,&pHVar2->super_Opnd);
    break;
  case JavascriptString_Replace:
    pHVar2 = IR::HelperCallOpnd::New(HelperString_Replace,callInstr->m_func);
    IR::Instr::SetSrc1(callInstr,&pHVar2->super_Opnd);
    break;
  case JavascriptString_Search:
    pHVar2 = IR::HelperCallOpnd::New(HelperString_Search,callInstr->m_func);
    IR::Instr::SetSrc1(callInstr,&pHVar2->super_Opnd);
    break;
  case JavascriptString_Slice:
    pHVar2 = IR::HelperCallOpnd::New(HelperString_Slice,callInstr->m_func);
    IR::Instr::SetSrc1(callInstr,&pHVar2->super_Opnd);
    break;
  case JavascriptString_Split:
    pHVar2 = IR::HelperCallOpnd::New(HelperString_Split,callInstr->m_func);
    IR::Instr::SetSrc1(callInstr,&pHVar2->super_Opnd);
    break;
  case JavascriptString_Substr:
    pHVar2 = IR::HelperCallOpnd::New(HelperString_Substr,callInstr->m_func);
    IR::Instr::SetSrc1(callInstr,&pHVar2->super_Opnd);
    break;
  case JavascriptString_Substring:
    pHVar2 = IR::HelperCallOpnd::New(HelperString_Substring,callInstr->m_func);
    IR::Instr::SetSrc1(callInstr,&pHVar2->super_Opnd);
    break;
  case JavascriptString_ToLocaleLowerCase:
    pHVar2 = IR::HelperCallOpnd::New(HelperString_ToLocaleLowerCase,callInstr->m_func);
    IR::Instr::SetSrc1(callInstr,&pHVar2->super_Opnd);
    break;
  case JavascriptString_ToLocaleUpperCase:
    pHVar2 = IR::HelperCallOpnd::New(HelperString_ToLocaleUpperCase,callInstr->m_func);
    IR::Instr::SetSrc1(callInstr,&pHVar2->super_Opnd);
    break;
  case JavascriptString_ToLowerCase:
    pHVar2 = IR::HelperCallOpnd::New(HelperString_ToLowerCase,callInstr->m_func);
    IR::Instr::SetSrc1(callInstr,&pHVar2->super_Opnd);
    break;
  case JavascriptString_ToUpperCase:
    pHVar2 = IR::HelperCallOpnd::New(HelperString_ToUpperCase,callInstr->m_func);
    IR::Instr::SetSrc1(callInstr,&pHVar2->super_Opnd);
    break;
  case JavascriptString_Trim:
    pHVar2 = IR::HelperCallOpnd::New(HelperString_Trim,callInstr->m_func);
    IR::Instr::SetSrc1(callInstr,&pHVar2->super_Opnd);
    break;
  case JavascriptString_TrimLeft:
    pHVar2 = IR::HelperCallOpnd::New(HelperString_TrimLeft,callInstr->m_func);
    IR::Instr::SetSrc1(callInstr,&pHVar2->super_Opnd);
    break;
  case JavascriptString_TrimRight:
    pHVar2 = IR::HelperCallOpnd::New(HelperString_TrimRight,callInstr->m_func);
    IR::Instr::SetSrc1(callInstr,&pHVar2->super_Opnd);
    break;
  case JavascriptArray_At:
    pHVar2 = IR::HelperCallOpnd::New(HelperArray_At,callInstr->m_func);
    IR::Instr::SetSrc1(callInstr,&pHVar2->super_Opnd);
    break;
  case JavascriptArray_Concat:
    pHVar2 = IR::HelperCallOpnd::New(HelperArray_Concat,callInstr->m_func);
    IR::Instr::SetSrc1(callInstr,&pHVar2->super_Opnd);
    break;
  case JavascriptArray_IndexOf:
    pHVar2 = IR::HelperCallOpnd::New(HelperArray_IndexOf,callInstr->m_func);
    IR::Instr::SetSrc1(callInstr,&pHVar2->super_Opnd);
    break;
  case JavascriptArray_Includes:
    pHVar2 = IR::HelperCallOpnd::New(HelperArray_Includes,callInstr->m_func);
    IR::Instr::SetSrc1(callInstr,&pHVar2->super_Opnd);
    break;
  case JavascriptArray_IsArray:
    pHVar2 = IR::HelperCallOpnd::New(HelperArray_IsArray,callInstr->m_func);
    IR::Instr::SetSrc1(callInstr,&pHVar2->super_Opnd);
    break;
  case JavascriptArray_Join:
    pHVar2 = IR::HelperCallOpnd::New(HelperArray_Join,callInstr->m_func);
    IR::Instr::SetSrc1(callInstr,&pHVar2->super_Opnd);
    break;
  case JavascriptArray_LastIndexOf:
    pHVar2 = IR::HelperCallOpnd::New(HelperArray_LastIndexOf,callInstr->m_func);
    IR::Instr::SetSrc1(callInstr,&pHVar2->super_Opnd);
    break;
  case JavascriptArray_Reverse:
    pHVar2 = IR::HelperCallOpnd::New(HelperArray_Reverse,callInstr->m_func);
    IR::Instr::SetSrc1(callInstr,&pHVar2->super_Opnd);
    break;
  case JavascriptArray_Shift:
    pHVar2 = IR::HelperCallOpnd::New(HelperArray_Shift,callInstr->m_func);
    IR::Instr::SetSrc1(callInstr,&pHVar2->super_Opnd);
    break;
  case JavascriptArray_Slice:
    pHVar2 = IR::HelperCallOpnd::New(HelperArray_Slice,callInstr->m_func);
    IR::Instr::SetSrc1(callInstr,&pHVar2->super_Opnd);
    break;
  case JavascriptArray_Splice:
    pHVar2 = IR::HelperCallOpnd::New(HelperArray_Splice,callInstr->m_func);
    IR::Instr::SetSrc1(callInstr,&pHVar2->super_Opnd);
    break;
  case JavascriptArray_Unshift:
    pHVar2 = IR::HelperCallOpnd::New(HelperArray_Unshift,callInstr->m_func);
    IR::Instr::SetSrc1(callInstr,&pHVar2->super_Opnd);
    break;
  case GlobalObject_ParseInt:
    pHVar2 = IR::HelperCallOpnd::New(HelperGlobalObject_ParseInt,callInstr->m_func);
    IR::Instr::SetSrc1(callInstr,&pHVar2->super_Opnd);
    break;
  case JavascriptRegExp_Exec:
    pHVar2 = IR::HelperCallOpnd::New(HelperRegExp_Exec,callInstr->m_func);
    IR::Instr::SetSrc1(callInstr,&pHVar2->super_Opnd);
    break;
  case JavascriptRegExp_SymbolSearch:
    pHVar2 = IR::HelperCallOpnd::New(HelperRegExp_SymbolSearch,callInstr->m_func);
    IR::Instr::SetSrc1(callInstr,&pHVar2->super_Opnd);
    break;
  case JavascriptString_PadStart:
    pHVar2 = IR::HelperCallOpnd::New(HelperString_PadStart,callInstr->m_func);
    IR::Instr::SetSrc1(callInstr,&pHVar2->super_Opnd);
    break;
  case JavascriptString_PadEnd:
    pHVar2 = IR::HelperCallOpnd::New(HelperString_PadEnd,callInstr->m_func);
    IR::Instr::SetSrc1(callInstr,&pHVar2->super_Opnd);
    break;
  case JavascriptObject_HasOwnProperty:
    pHVar2 = IR::HelperCallOpnd::New(HelperObject_HasOwnProperty,callInstr->m_func);
    IR::Instr::SetSrc1(callInstr,&pHVar2->super_Opnd);
    break;
  case JavascriptObject_HasOwn:
    pHVar2 = IR::HelperCallOpnd::New(HelperObject_HasOwn,callInstr->m_func);
    IR::Instr::SetSrc1(callInstr,&pHVar2->super_Opnd);
  }
  newSrc = IR::Instr::GetDst(argoutInstr);
  IR::Instr::SetSrc2(callInstr,newSrc);
  return;
}

Assistant:

void
Inline::SetupInlineInstrForCallDirect(Js::BuiltinFunction builtInId, IR::Instr* callInstr, IR::Instr* argoutInstr)
{
    switch(builtInId)
    {
    case Js::BuiltinFunction::JavascriptArray_At:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperArray_At, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptArray_Concat:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperArray_Concat, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptArray_IndexOf:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperArray_IndexOf, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptArray_Includes:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperArray_Includes, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptArray_Join:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperArray_Join, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptArray_LastIndexOf:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperArray_LastIndexOf, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptArray_Reverse:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperArray_Reverse, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptArray_Shift:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperArray_Shift, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptArray_Slice:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperArray_Slice, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptArray_Splice:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperArray_Splice, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptArray_Unshift:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperArray_Unshift, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptString_At:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperString_At, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptString_Concat:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperString_Concat, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptString_CharCodeAt:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperString_CharCodeAt, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptString_CharAt:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperString_CharAt, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptString_FromCharCode:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperString_FromCharCode, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptString_FromCodePoint:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperString_FromCodePoint, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptString_IndexOf:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperString_IndexOf, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptString_LastIndexOf:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperString_LastIndexOf, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptString_Link:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperString_Link, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptString_Match:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperString_Match, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptString_Replace:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperString_Replace, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptString_Search:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperString_Search, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptString_Slice:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperString_Slice, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptString_Split:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperString_Split, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptString_Substr:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperString_Substr, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptString_Substring:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperString_Substring, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptString_ToLocaleLowerCase:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperString_ToLocaleLowerCase, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptString_ToLocaleUpperCase:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperString_ToLocaleUpperCase, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptString_ToLowerCase:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperString_ToLowerCase, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptString_ToUpperCase:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperString_ToUpperCase, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptString_Trim:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperString_Trim, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptString_TrimLeft:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperString_TrimLeft, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptString_TrimRight:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperString_TrimRight, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptString_PadStart:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperString_PadStart, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptString_PadEnd:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperString_PadEnd, callInstr->m_func));
        break;

    case Js::BuiltinFunction::GlobalObject_ParseInt:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperGlobalObject_ParseInt, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptRegExp_Exec:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperRegExp_Exec, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptRegExp_SymbolSearch:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperRegExp_SymbolSearch, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptObject_HasOwnProperty:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperObject_HasOwnProperty, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptObject_HasOwn:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperObject_HasOwn, callInstr->m_func));
        break;

    case Js::BuiltinFunction::JavascriptArray_IsArray:
        callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::JnHelperMethod::HelperArray_IsArray, callInstr->m_func));
        break;
    };
    callInstr->SetSrc2(argoutInstr->GetDst());
    return;
}